

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::CommandPool>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  long *plVar1;
  Handle<(vk::HandleType)24> HVar2;
  deUint32 dVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  size_t sVar6;
  deUint64 *pdVar7;
  long *plVar8;
  int *piVar9;
  size_type __n;
  long lVar10;
  ulong uVar11;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  VkCommandPool local_218;
  undefined1 auStack_210 [8];
  undefined8 local_208;
  VkAllocationCallbacks *pVStack_200;
  VkDevice local_1f8;
  DeviceInterface *local_1f0;
  Move<vk::Handle<(vk::HandleType)24>_> local_1e8;
  undefined1 local_1c8 [8];
  VkAllocationCallbacks aVStack_1c0 [2];
  ios_base local_150 [264];
  VkCommandPoolCreateInfo local_48;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8,allocator,0x400);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = params.flags;
  local_48.queueFamilyIndex = dVar3;
  ::vk::createCommandPool(&local_1e8,vk,device,&local_48,aVStack_1c0);
  local_218.m_internal =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  auStack_210 = (undefined1  [8])
                local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_deviceIface;
  local_208 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  pVStack_200 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)auStack_210,local_218);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8);
  sVar4 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar5 - sVar4,0);
  __n = 0x4000;
  if (sVar4 < 0x4000) {
    __n = sVar4;
  }
  local_1f0 = Context::getDeviceInterface(context);
  local_1f8 = Context::getDevice(context);
  dVar3 = Context::getUniversalQueueFamilyIndex(context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
            *)&local_1e8,__n,(allocator_type *)local_1c8);
  local_1c8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)24>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)aVStack_1c0 +
                    (int)((DeviceInterface *)((long)aVStack_1c0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface);
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,__s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1c0);
  std::ios_base::~ios_base(local_150);
  if (sVar4 != 0) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      pdVar7 = (deUint64 *)operator_new(0x20);
      local_218.m_internal._0_4_ = 0x27;
      auStack_210 = (undefined1  [8])0x0;
      local_208 = (VkDevice)CONCAT44(dVar3,params.flags);
      ::vk::createCommandPool
                ((Move<vk::Handle<(vk::HandleType)24>_> *)local_1c8,local_1f0,local_1f8,
                 (VkCommandPoolCreateInfo *)&local_218,(VkAllocationCallbacks *)0x0);
      pdVar7[2] = (deUint64)aVStack_1c0[0].pfnAllocation;
      pdVar7[3] = (deUint64)aVStack_1c0[0].pfnReallocation;
      *pdVar7 = (deUint64)local_1c8;
      pdVar7[1] = (deUint64)aVStack_1c0[0].pUserData;
      local_1c8 = (undefined1  [8])0x0;
      aVStack_1c0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1c0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1c0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar8 = (long *)operator_new(0x20);
      HVar2.m_internal =
           local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
      *(undefined4 *)(plVar8 + 1) = 0;
      *(undefined4 *)((long)plVar8 + 0xc) = 0;
      *plVar8 = (long)&PTR__SharedPtrState_00d24c10;
      plVar8[2] = (long)pdVar7;
      *(undefined4 *)(plVar8 + 1) = 1;
      *(undefined4 *)((long)plVar8 + 0xc) = 1;
      plVar1 = *(long **)(local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                          m_internal + lVar10);
      if (plVar1 != plVar8) {
        if (plVar1 != (long *)0x0) {
          LOCK();
          plVar1 = plVar1 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            *(undefined8 *)
             ((long)(local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                     m_internal - 8) + lVar10) = 0;
            (**(code **)(**(long **)(local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data
                                     .object.m_internal + lVar10) + 0x10))();
          }
          LOCK();
          piVar9 = (int *)(*(long *)(HVar2.m_internal + lVar10) + 0xc);
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (*(long **)(HVar2.m_internal + lVar10) != (long *)0x0) {
              (**(code **)(**(long **)(HVar2.m_internal + lVar10) + 8))();
            }
            *(undefined8 *)(HVar2.m_internal + lVar10) = 0;
          }
        }
        *(deUint64 **)((long)(HVar2.m_internal - 8) + lVar10) = pdVar7;
        *(long **)(HVar2.m_internal + lVar10) = plVar8;
        LOCK();
        *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        UNLOCK();
        LOCK();
        piVar9 = (int *)(*(long *)(HVar2.m_internal + lVar10) + 0xc);
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      plVar1 = plVar8 + 1;
      LOCK();
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar8 + 0x10))(plVar8);
      }
      piVar9 = (int *)((long)plVar8 + 0xc);
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if (local_1c8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)24>_> *)aVStack_1c0,(VkCommandPool)local_1c8)
        ;
      }
      if ((uVar11 & 0x3ff) == 0 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
                     *)&local_1e8,
                    (pointer)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                             m_internal);
  local_1c8 = (undefined1  [8])&aVStack_1c0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1c8,
             (undefined1 *)((long)(_func_int ***)aVStack_1c0[0].pUserData + (long)local_1c8));
  if (local_1c8 != (undefined1  [8])&aVStack_1c0[0].pfnAllocation) {
    operator_delete((void *)local_1c8,(ulong)(aVStack_1c0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>_>_>_>
             *)&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}